

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O0

Lazy<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
__thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::RRLoadBlancer::
operator()(RRLoadBlancer *this,
          load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool> *load_blancer)

{
  uint uVar1;
  bool bVar2;
  undefined8 *puVar3;
  pointer paVar4;
  size_type sVar5;
  undefined8 *extraout_RAX;
  long *plVar6;
  vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
  *this_00;
  long in_RDX;
  undefined8 in_RSI;
  LazyBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_false>
  in_RDI;
  __int_type_conflict1 i;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  void *in_stack_fffffffffffffee0;
  LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
  *in_stack_fffffffffffffee8;
  
  puVar3 = (undefined8 *)operator_new(0x58,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::
    LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
    ::get_return_object_on_allocation_failure();
  }
  else {
    *puVar3 = operator();
    puVar3[1] = operator();
    plVar6 = puVar3 + 8;
    puVar3[9] = in_RSI;
    *plVar6 = in_RDX;
    async_simple::coro::detail::
    LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
    ::LazyPromise((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                   *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    async_simple::coro::detail::
    LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
    ::get_return_object(in_stack_fffffffffffffee8);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x51));
    if (bVar2) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x51));
      paVar4 = std::
               unique_ptr<std::atomic<unsigned_int>,_std::default_delete<std::atomic<unsigned_int>_>_>
               ::operator->((unique_ptr<std::atomic<unsigned_int>,_std::default_delete<std::atomic<unsigned_int>_>_>
                             *)0x2e03c8);
      LOCK();
      uVar1 = (paVar4->super___atomic_base<unsigned_int>)._M_i;
      (paVar4->super___atomic_base<unsigned_int>)._M_i =
           (paVar4->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
      this_00 = (vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
                 *)(*plVar6 + 0x158);
      sVar5 = std::
              vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
              ::size((vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
                      *)(*plVar6 + 0x158));
      std::
      vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
      ::operator[](this_00,(ulong)uVar1 % sVar5);
      async_simple::coro::detail::
      LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
      ::
      return_value<const_std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_&>
                ((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                  *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar3 + 2));
      bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                        ((FinalAwaiter *)((long)puVar3 + 0x52));
      if (bVar2) {
        async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                  ((FinalAwaiter *)((long)puVar3 + 0x52));
        async_simple::coro::detail::
        LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
        ::~LazyPromise((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                        *)0x2e05e7);
        if (puVar3 != (undefined8 *)0x0) {
          operator_delete(puVar3,0x58);
        }
      }
      else {
        *puVar3 = 0;
        *(undefined1 *)(puVar3 + 10) = 1;
        coro_io::load_blancer
                  (in_stack_fffffffffffffee0,
                   (void *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)(puVar3 + 10) = 0;
      coro_io::load_blancer
                (in_stack_fffffffffffffee0,
                 (void *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
  }
  return (Lazy<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
          )in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::shared_ptr<client_pool_t>> operator()(
        const load_blancer& load_blancer) {
      auto i = index->fetch_add(1, std::memory_order_relaxed);
      co_return load_blancer
          .client_pools_[i % load_blancer.client_pools_.size()];
    }